

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luckySimple.c
# Opt level: O2

int oneBitPosition(int x,int size)

{
  uint uVar1;
  uint uVar2;
  
  uVar2 = 0;
  if (size < 1) {
    size = 0;
  }
  for (; (uVar1 = 0xffffffff, size != uVar2 && (uVar1 = uVar2, ((uint)x >> (uVar2 & 0x1f) & 1) == 0)
         ); uVar2 = uVar2 + 1) {
  }
  return uVar1;
}

Assistant:

int oneBitPosition(int x, int size)
{
	int i;
	for(i=0;i<size;i++)
		if((x>>i)&1)
			return i;
	return -1;
}